

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fsnav.c
# Opt level: O0

char fsnav_remove_plugin(_func_void *plugin)

{
  ulong uVar1;
  int iVar2;
  undefined4 uVar3;
  fsnav_plugin *pfVar4;
  fsnav_plugin *pfVar5;
  fsnav_plugin *reallocated_pointer;
  ulong uStack_28;
  char flag;
  size_t j;
  size_t i;
  _func_void *plugin_local;
  
  reallocated_pointer._7_1_ = '\0';
  for (j = 0; j < (fsnav->core).plugin_count; j = j + 1) {
    uVar1 = j;
    if ((fsnav->core).plugins[j].func == plugin) {
      while (uStack_28 = uVar1 + 1, uStack_28 < (fsnav->core).plugin_count) {
        pfVar4 = (fsnav->core).plugins + uVar1;
        pfVar5 = (fsnav->core).plugins + uStack_28;
        pfVar4->func = pfVar5->func;
        iVar2 = pfVar5->shift;
        pfVar4->cycle = pfVar5->cycle;
        pfVar4->shift = iVar2;
        uVar3 = *(undefined4 *)&pfVar5->field_0x14;
        pfVar4->tick = pfVar5->tick;
        *(undefined4 *)&pfVar4->field_0x14 = uVar3;
        uVar1 = uStack_28;
      }
      (fsnav->core).plugins[uVar1].func = (_func_void *)0x0;
      (fsnav->core).plugins[uVar1].cycle = 0;
      (fsnav->core).plugins[uVar1].shift = 0;
      (fsnav->core).plugins[uVar1].tick = 0;
      (fsnav->core).plugin_count = (fsnav->core).plugin_count - 1;
      if (reallocated_pointer._7_1_ < 0xff) {
        reallocated_pointer._7_1_ = reallocated_pointer._7_1_ + '\x01';
      }
    }
  }
  pfVar4 = (fsnav_plugin *)realloc((fsnav->core).plugins,(fsnav->core).plugin_count * 0x18);
  if (((fsnav->core).plugin_count == 0) || (pfVar4 != (fsnav_plugin *)0x0)) {
    (fsnav->core).plugins = pfVar4;
    plugin_local._7_1_ = reallocated_pointer._7_1_;
  }
  else {
    fsnav_free();
    plugin_local._7_1_ = '\0';
  }
  return plugin_local._7_1_;
}

Assistant:

char fsnav_remove_plugin(void(*plugin)(void))
{
	size_t       i, j;
	char         flag = 0;
	fsnav_plugin* reallocated_pointer;

	for (i = 0; i < fsnav->core.plugin_count; i++) { // go through the execution list
		if (fsnav->core.plugins[i].func != plugin)   // if not the requested plugin, do nothing
			continue;
		// otherwise, remove the current plugin from the execution list
		for (j = i+1; j < fsnav->core.plugin_count; j++) // copy all succeeding plugins one position lower
			fsnav->core.plugins[j-1] = fsnav->core.plugins[j];
		// reset the last one
		j--;
		fsnav->core.plugins[j].func  = NULL;
		fsnav->core.plugins[j].cycle = 0;
		fsnav->core.plugins[j].shift = 0;
		fsnav->core.plugins[j].tick  = 0;
		fsnav->core.plugin_count--;
		if (flag < 0xff)
			flag++;
	}

	// reallocate memory
	reallocated_pointer = (fsnav_plugin*)realloc((void*)(fsnav->core.plugins), fsnav->core.plugin_count*sizeof(fsnav_plugin));
	if (fsnav->core.plugin_count > 0 && reallocated_pointer == NULL) { // memory reallocation somehow failed
		fsnav_free();
		return 0;
	}
	fsnav->core.plugins = reallocated_pointer;

	return flag;
}